

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void empty_readdir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = readdir_req.ptr;
  if (req == &readdir_req) {
    if (readdir_req.fs_type != UV_FS_READDIR) goto LAB_0015af91;
    if (readdir_req.result != 0) goto LAB_0015af96;
    uv_fs_req_cleanup(&readdir_req);
    req = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_closedir(req,&closedir_req,pvVar1,empty_closedir_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    empty_readdir_cb_cold_1();
LAB_0015af91:
    empty_readdir_cb_cold_2();
LAB_0015af96:
    empty_readdir_cb_cold_3();
  }
  empty_readdir_cb_cold_4();
  if (req == &closedir_req) {
    if (closedir_req.fs_type == UV_FS_CLOSEDIR) {
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_0015afdd;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_0015afdd:
  empty_closedir_cb_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(req,0);
  return;
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &readdir_req);
  ASSERT(req->fs_type == UV_FS_READDIR);
  ASSERT(req->result == 0);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT(r == 0);
}